

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

UINT16 TPMU_SCHEME_KEYEDHASH_Marshal
                 (TPMU_SCHEME_KEYEDHASH *source,BYTE **buffer,INT32 *size,UINT32 selector)

{
  UINT16 UVar1;
  
  if (selector == 10) {
    UINT16_Marshal(&(source->hmac).hashAlg,buffer,size);
    UINT16_Marshal(&(source->alg_xor).kdf,buffer,size);
    UVar1 = 4;
  }
  else if (selector == 5) {
    UINT16_Marshal(&(source->hmac).hashAlg,buffer,size);
    UVar1 = 2;
  }
  else {
    UVar1 = 0;
  }
  return UVar1;
}

Assistant:

UINT16
TPMU_SCHEME_KEYEDHASH_Marshal(TPMU_SCHEME_KEYEDHASH *source, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
#if         ALG_HMAC
        case TPM_ALG_HMAC:
            return TPMS_SCHEME_HMAC_Marshal((TPMS_SCHEME_HMAC *)&(source->hmac), buffer, size);
#endif // ALG_HMAC
#if         ALG_XOR
        case TPM_ALG_XOR:
            return TPMS_SCHEME_XOR_Marshal((TPMS_SCHEME_XOR *)&(source->alg_xor), buffer, size);
#endif // ALG_XOR
        case TPM_ALG_NULL:
            return 0;
    }
    return 0;
}